

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall VW::ptr_queue<example>::push(ptr_queue<example> *this,example *item)

{
  iterator *piVar1;
  _Map_pointer pppeVar2;
  _Elt_pointer ppeVar3;
  unique_lock<std::mutex> lock;
  example *local_30;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mut;
  local_28._M_owns = false;
  local_30 = item;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  while (pppeVar2 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node,
        ppeVar3 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur,
        ((long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)ppeVar3 -
         (long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)pppeVar2 -
                  (long)(this->object_queue).c.
                        super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppeVar2 == (_Map_pointer)0x0)) * 0x40 == this->max_size) {
    std::condition_variable::wait((unique_lock *)&this->is_not_full);
  }
  if (ppeVar3 ==
      (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<example*,std::allocator<example*>>::_M_push_back_aux<example*const&>
              ((deque<example*,std::allocator<example*>> *)&this->object_queue,&local_30);
  }
  else {
    *ppeVar3 = local_30;
    piVar1 = &(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::unique_lock<std::mutex>::unlock(&local_28);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void push(T* item)
    {
      std::unique_lock<std::mutex> lock(mut);
      while (object_queue.size() == max_size)
      {
        is_not_full.wait(lock);
      }

      object_queue.push(item);

      lock.unlock();
      is_not_empty.notify_all();
    }